

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

char * Curl_checkProxyheaders(connectdata *conn,char *thisheader)

{
  undefined8 *puVar1;
  int iVar2;
  size_t max;
  long lVar3;
  long *plVar4;
  
  max = strlen(thisheader);
  if (((conn->bits).proxy != true) || (lVar3 = 0x390, (conn->data->set).sep_headers == false)) {
    lVar3 = 0x388;
  }
  plVar4 = (long *)((long)conn->data->sockets + lVar3 + -0x80);
  while( true ) {
    puVar1 = (undefined8 *)*plVar4;
    if (puVar1 == (undefined8 *)0x0) {
      return (char *)0x0;
    }
    iVar2 = Curl_strncasecompare((char *)*puVar1,thisheader,max);
    if (iVar2 != 0) break;
    plVar4 = puVar1 + 1;
  }
  return (char *)*puVar1;
}

Assistant:

char *Curl_checkProxyheaders(const struct connectdata *conn,
                             const char *thisheader)
{
  struct curl_slist *head;
  size_t thislen = strlen(thisheader);
  struct Curl_easy *data = conn->data;

  for(head = (conn->bits.proxy && data->set.sep_headers) ?
        data->set.proxyheaders : data->set.headers;
      head; head=head->next) {
    if(strncasecompare(head->data, thisheader, thislen))
      return head->data;
  }

  return NULL;
}